

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_b3fcdf::X509Test_Attribute_Test::TestBody(X509Test_Attribute_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  _Head_base<0UL,_asn1_string_st_*,_false> a;
  int iVar2;
  X509_ATTRIBUTE *pXVar3;
  ASN1_OBJECT *pAVar4;
  ASN1_STRING *pAVar5;
  uint32_t mask;
  uint32_t mask_00;
  uint32_t mask_01;
  uint32_t mask_02;
  uint32_t mask_03;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t mask_04;
  char *in_R9;
  bool bVar6;
  UniquePtr<X509_ATTRIBUTE> attr;
  UniquePtr<ASN1_STRING> str;
  uint8_t kOne;
  AssertHelper local_68;
  AssertHelper local_60;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  string local_40;
  _Head_base<0UL,_asn1_string_st_*,_false> local_20;
  undefined1 local_11;
  
  local_20._M_head_impl = (asn1_string_st *)ASN1_STRING_type_new(0x1e);
  local_58[0] = (internal)(local_20._M_head_impl != (asn1_string_st *)0x0);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_20._M_head_impl == (asn1_string_st *)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,local_58,(AssertionResult *)0x5194ea,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x1072,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_48);
  }
  else {
    iVar2 = ASN1_STRING_set((ASN1_STRING *)local_20._M_head_impl,"&\x03",2);
    local_58[0] = (internal)(iVar2 != 0);
    local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_58[0]) {
      local_48._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           X509_ATTRIBUTE_create(0x9c,0x1e,local_20._M_head_impl);
      local_58[0] = (internal)((X509_ATTRIBUTE *)local_48._M_head_impl != (X509_ATTRIBUTE *)0x0);
      local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((X509_ATTRIBUTE *)local_48._M_head_impl == (X509_ATTRIBUTE *)0x0) {
        testing::Message::Message((Message *)&local_68);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_40,local_58,(AssertionResult *)0x5a5ed5,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x1078,local_40._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
LAB_003c1bf6:
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        if (local_68.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_68.data_ + 8))();
        }
        if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_50,local_50);
        }
      }
      else {
        local_20._M_head_impl = (asn1_string_st *)0x0;
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_48._M_head_impl,(X509_ATTRIBUTE *)0x1,mask);
        pXVar3 = X509_ATTRIBUTE_new();
        _Var1._M_head_impl = local_48._M_head_impl;
        bVar6 = (X509_ATTRIBUTE *)local_48._M_head_impl != (X509_ATTRIBUTE *)0x0;
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pXVar3;
        if (bVar6) {
          X509_ATTRIBUTE_free((X509_ATTRIBUTE *)_Var1._M_head_impl);
        }
        _Var1._M_head_impl = local_48._M_head_impl;
        local_58[0] = (internal)((X509_ATTRIBUTE *)local_48._M_head_impl != (X509_ATTRIBUTE *)0x0);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((X509_ATTRIBUTE *)local_48._M_head_impl == (X509_ATTRIBUTE *)0x0) {
          testing::Message::Message((Message *)&local_68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_40,local_58,(AssertionResult *)0x5a5ed5,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x107e,local_40._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
          goto LAB_003c1bf6;
        }
        pAVar4 = OBJ_nid2obj(0x9c);
        iVar2 = X509_ATTRIBUTE_set1_object((X509_ATTRIBUTE *)_Var1._M_head_impl,pAVar4);
        local_58[0] = (internal)(iVar2 != 0);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_40,local_58,
                     (AssertionResult *)"X509_ATTRIBUTE_set1_object(attr.get(), OBJ_nid2obj(156))",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1080,local_40._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
          goto LAB_003c1bf6;
        }
        iVar2 = X509_ATTRIBUTE_set1_data
                          ((X509_ATTRIBUTE *)local_48._M_head_impl,0x1000,TestBody::kTest1UTF8,3);
        local_58[0] = (internal)(iVar2 != 0);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_40,local_58,
                     (AssertionResult *)
                     "X509_ATTRIBUTE_set1_data(attr.get(), (0x1000), kTest1UTF8, sizeof(kTest1UTF8))"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1082,local_40._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
          goto LAB_003c1bf6;
        }
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_48._M_head_impl,(X509_ATTRIBUTE *)0x1,mask_00);
        iVar2 = X509_ATTRIBUTE_set1_data((X509_ATTRIBUTE *)local_48._M_head_impl,0x1e,"",8);
        local_58[0] = (internal)(iVar2 != 0);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_40,local_58,
                     (AssertionResult *)
                     "X509_ATTRIBUTE_set1_data(attr.get(), 30, kTest2, sizeof(kTest2))","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1087,local_40._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
          goto LAB_003c1bf6;
        }
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_48._M_head_impl,(X509_ATTRIBUTE *)0x3,mask_01);
        local_11 = 1;
        iVar2 = X509_ATTRIBUTE_set1_data((X509_ATTRIBUTE *)local_48._M_head_impl,0x102,&local_11,1);
        local_58[0] = (internal)(iVar2 != 0);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_40,local_58,
                     (AssertionResult *)
                     "X509_ATTRIBUTE_set1_data(attr.get(), (2 | 0x100), &kOne, 1)","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x108e,local_40._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
          goto LAB_003c1bf6;
        }
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_48._M_head_impl,(X509_ATTRIBUTE *)&DAT_00000007,
                   mask_02);
        pXVar3 = X509_ATTRIBUTE_new();
        _Var1._M_head_impl = local_48._M_head_impl;
        bVar6 = (X509_ATTRIBUTE *)local_48._M_head_impl != (X509_ATTRIBUTE *)0x0;
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pXVar3;
        if (bVar6) {
          X509_ATTRIBUTE_free((X509_ATTRIBUTE *)_Var1._M_head_impl);
        }
        _Var1._M_head_impl = local_48._M_head_impl;
        local_58[0] = (internal)((X509_ATTRIBUTE *)local_48._M_head_impl != (X509_ATTRIBUTE *)0x0);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((X509_ATTRIBUTE *)local_48._M_head_impl == (X509_ATTRIBUTE *)0x0) {
          testing::Message::Message((Message *)&local_68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_40,local_58,(AssertionResult *)0x5a5ed5,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1093,local_40._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
          goto LAB_003c1bf6;
        }
        pAVar4 = OBJ_nid2obj(0x9c);
        iVar2 = X509_ATTRIBUTE_set1_object((X509_ATTRIBUTE *)_Var1._M_head_impl,pAVar4);
        local_58[0] = (internal)(iVar2 != 0);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_40,local_58,
                     (AssertionResult *)"X509_ATTRIBUTE_set1_object(attr.get(), OBJ_nid2obj(156))",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1095,local_40._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
          goto LAB_003c1bf6;
        }
        pAVar5 = ASN1_STRING_type_new(0x1e);
        a._M_head_impl = local_20._M_head_impl;
        bVar6 = local_20._M_head_impl != (asn1_string_st *)0x0;
        local_20._M_head_impl = (asn1_string_st *)pAVar5;
        if (bVar6) {
          ASN1_STRING_free((ASN1_STRING *)a._M_head_impl);
        }
        local_58[0] = (internal)(local_20._M_head_impl != (asn1_string_st *)0x0);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_20._M_head_impl == (asn1_string_st *)0x0) {
          testing::Message::Message((Message *)&local_68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_40,local_58,(AssertionResult *)0x5194ea,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1097,local_40._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
          goto LAB_003c1bf6;
        }
        iVar2 = ASN1_STRING_set((ASN1_STRING *)local_20._M_head_impl,"&\x03",2);
        local_58[0] = (internal)(iVar2 != 0);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_40,local_58,
                     (AssertionResult *)"ASN1_STRING_set(str.get(), kTest1, sizeof(kTest1))","false"
                     ,"true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1098,local_40._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
          goto LAB_003c1bf6;
        }
        iVar2 = X509_ATTRIBUTE_set1_data
                          ((X509_ATTRIBUTE *)local_48._M_head_impl,0x1e,local_20._M_head_impl,-1);
        local_58[0] = (internal)(iVar2 != 0);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_40,local_58,
                     (AssertionResult *)"X509_ATTRIBUTE_set1_data(attr.get(), 30, str.get(), -1)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x109a,local_40._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
          goto LAB_003c1bf6;
        }
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_48._M_head_impl,(X509_ATTRIBUTE *)0x1,mask_03);
        pXVar3 = X509_ATTRIBUTE_create_by_NID((X509_ATTRIBUTE **)0x0,0x9c,0,(void *)0x0,0);
        _Var1._M_head_impl = local_48._M_head_impl;
        bVar6 = (X509_ATTRIBUTE *)local_48._M_head_impl != (X509_ATTRIBUTE *)0x0;
        mask_04 = extraout_EDX;
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pXVar3;
        if (bVar6) {
          X509_ATTRIBUTE_free((X509_ATTRIBUTE *)_Var1._M_head_impl);
          mask_04 = extraout_EDX_00;
        }
        local_58[0] = (internal)((X509_ATTRIBUTE *)local_48._M_head_impl != (X509_ATTRIBUTE *)0x0);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((X509_ATTRIBUTE *)local_48._M_head_impl == (X509_ATTRIBUTE *)0x0) {
          testing::Message::Message((Message *)&local_68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_40,local_58,(AssertionResult *)0x5a5ed5,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x10a0,local_40._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
          goto LAB_003c1bf6;
        }
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)local_48._M_head_impl,(X509_ATTRIBUTE *)0x0,mask_04);
      }
      std::unique_ptr<x509_attributes_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_attributes_st,_bssl::internal::Deleter> *)&local_48);
      goto LAB_003c1c46;
    }
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,local_58,
               (AssertionResult *)"ASN1_STRING_set(str.get(), kTest1, sizeof(kTest1))","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x1073,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_48);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((X509_ATTRIBUTE *)local_48._M_head_impl != (X509_ATTRIBUTE *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
LAB_003c1c46:
  std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&local_20);
  return;
}

Assistant:

TEST(X509Test, Attribute) {
  // The expected attribute values are:
  // 1. BMPString U+2603
  // 2. BMPString "test"
  // 3. INTEGER -1 (not valid for friendlyName)
  static const uint8_t kTest1[] = {0x26, 0x03};  // U+2603 SNOWMAN
  static const uint8_t kTest1UTF8[] = {0xe2, 0x98, 0x83};
  static const uint8_t kTest2[] = {0, 't', 0, 'e', 0, 's', 0, 't'};

  constexpr uint32_t kTest1Mask = 1 << 0;
  constexpr uint32_t kTest2Mask = 1 << 1;
  constexpr uint32_t kTest3Mask = 1 << 2;
  auto check_attribute = [&](X509_ATTRIBUTE *attr, uint32_t mask) {
    EXPECT_EQ(NID_friendlyName, OBJ_obj2nid(X509_ATTRIBUTE_get0_object(attr)));

    int idx = 0;
    if (mask & kTest1Mask) {
      // The first attribute should contain |kTest1|.
      const ASN1_TYPE *value = X509_ATTRIBUTE_get0_type(attr, idx);
      ASSERT_TRUE(value);
      EXPECT_EQ(V_ASN1_BMPSTRING, value->type);
      EXPECT_EQ(Bytes(kTest1),
                Bytes(ASN1_STRING_get0_data(value->value.bmpstring),
                      ASN1_STRING_length(value->value.bmpstring)));

      // |X509_ATTRIBUTE_get0_data| requires the type match.
      EXPECT_FALSE(
          X509_ATTRIBUTE_get0_data(attr, idx, V_ASN1_OCTET_STRING, nullptr));
      const ASN1_BMPSTRING *bmpstring = static_cast<const ASN1_BMPSTRING *>(
          X509_ATTRIBUTE_get0_data(attr, idx, V_ASN1_BMPSTRING, nullptr));
      ASSERT_TRUE(bmpstring);
      EXPECT_EQ(Bytes(kTest1), Bytes(ASN1_STRING_get0_data(bmpstring),
                                     ASN1_STRING_length(bmpstring)));
      idx++;
    }

    if (mask & kTest2Mask) {
      const ASN1_TYPE *value = X509_ATTRIBUTE_get0_type(attr, idx);
      ASSERT_TRUE(value);
      EXPECT_EQ(V_ASN1_BMPSTRING, value->type);
      EXPECT_EQ(Bytes(kTest2),
                Bytes(ASN1_STRING_get0_data(value->value.bmpstring),
                      ASN1_STRING_length(value->value.bmpstring)));
      idx++;
    }

    if (mask & kTest3Mask) {
      const ASN1_TYPE *value = X509_ATTRIBUTE_get0_type(attr, idx);
      ASSERT_TRUE(value);
      EXPECT_EQ(V_ASN1_INTEGER, value->type);
      int64_t v;
      ASSERT_TRUE(ASN1_INTEGER_get_int64(&v, value->value.integer));
      EXPECT_EQ(v, -1);
      idx++;
    }

    EXPECT_FALSE(X509_ATTRIBUTE_get0_type(attr, idx));
  };

  bssl::UniquePtr<ASN1_STRING> str(ASN1_STRING_type_new(V_ASN1_BMPSTRING));
  ASSERT_TRUE(str);
  ASSERT_TRUE(ASN1_STRING_set(str.get(), kTest1, sizeof(kTest1)));

  // Test |X509_ATTRIBUTE_create|.
  bssl::UniquePtr<X509_ATTRIBUTE> attr(
      X509_ATTRIBUTE_create(NID_friendlyName, V_ASN1_BMPSTRING, str.get()));
  ASSERT_TRUE(attr);
  str.release();  // |X509_ATTRIBUTE_create| takes ownership on success.
  check_attribute(attr.get(), kTest1Mask);

  // Test the |MBSTRING_*| form of |X509_ATTRIBUTE_set1_data|.
  attr.reset(X509_ATTRIBUTE_new());
  ASSERT_TRUE(attr);
  ASSERT_TRUE(
      X509_ATTRIBUTE_set1_object(attr.get(), OBJ_nid2obj(NID_friendlyName)));
  ASSERT_TRUE(X509_ATTRIBUTE_set1_data(attr.get(), MBSTRING_UTF8, kTest1UTF8,
                                       sizeof(kTest1UTF8)));
  check_attribute(attr.get(), kTest1Mask);

  // Test the |ASN1_STRING| form of |X509_ATTRIBUTE_set1_data|.
  ASSERT_TRUE(X509_ATTRIBUTE_set1_data(attr.get(), V_ASN1_BMPSTRING, kTest2,
                                       sizeof(kTest2)));
  check_attribute(attr.get(), kTest1Mask | kTest2Mask);

  // The |ASN1_STRING| form of |X509_ATTRIBUTE_set1_data| should correctly
  // handle negative integers.
  const uint8_t kOne = 1;
  ASSERT_TRUE(
      X509_ATTRIBUTE_set1_data(attr.get(), V_ASN1_NEG_INTEGER, &kOne, 1));
  check_attribute(attr.get(), kTest1Mask | kTest2Mask | kTest3Mask);

  // Test the |ASN1_TYPE| form of |X509_ATTRIBUTE_set1_data|.
  attr.reset(X509_ATTRIBUTE_new());
  ASSERT_TRUE(attr);
  ASSERT_TRUE(
      X509_ATTRIBUTE_set1_object(attr.get(), OBJ_nid2obj(NID_friendlyName)));
  str.reset(ASN1_STRING_type_new(V_ASN1_BMPSTRING));
  ASSERT_TRUE(str);
  ASSERT_TRUE(ASN1_STRING_set(str.get(), kTest1, sizeof(kTest1)));
  ASSERT_TRUE(
      X509_ATTRIBUTE_set1_data(attr.get(), V_ASN1_BMPSTRING, str.get(), -1));
  check_attribute(attr.get(), kTest1Mask);

  // An |attrtype| of zero leaves the attribute empty.
  attr.reset(X509_ATTRIBUTE_create_by_NID(
      nullptr, NID_friendlyName, /*attrtype=*/0, /*data=*/nullptr, /*len=*/0));
  ASSERT_TRUE(attr);
  check_attribute(attr.get(), 0);
}